

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O2

void re_insert(EditLine *el,wchar_t *d,wchar_t dat,wchar_t dlen,wchar_t *s,wchar_t num)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 in_register_0000000c;
  undefined4 *puVar3;
  int iVar4;
  undefined4 *puVar5;
  
  puVar3 = (undefined4 *)CONCAT44(in_register_0000000c,dlen);
  iVar4 = (int)d;
  uVar2 = (ulong)(uint)(dat - iVar4);
  if ((int)s <= dat - iVar4) {
    uVar2 = (ulong)s & 0xffffffff;
  }
  if (0 < (int)uVar2) {
    puVar5 = (undefined4 *)((long)&el->el_prog + (long)dat * 4);
    while( true ) {
      puVar5 = puVar5 + -1;
      if (puVar5 + -uVar2 < (undefined4 *)((long)&el->el_prog + (long)iVar4 * 4)) break;
      *puVar5 = puVar5[-uVar2];
    }
    *(undefined4 *)((long)&el->el_prog + (long)dat * 4) = 0;
  }
  puVar5 = (undefined4 *)((long)&el->el_prog + (long)iVar4 * 4);
  for (; (puVar5 < (undefined4 *)((long)&el->el_prog + (long)dat * 4) && (0 < (int)uVar2));
      uVar2 = (ulong)((int)uVar2 - 1)) {
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
    *puVar5 = uVar1;
    puVar5 = puVar5 + 1;
  }
  return;
}

Assistant:

static void
/*ARGSUSED*/
re_insert(EditLine *el __attribute__((__unused__)),
    wchar_t *d, int dat, int dlen, wchar_t *s, int num)
{
	wchar_t *a, *b;

	if (num <= 0)
		return;
	if (num > dlen - dat)
		num = dlen - dat;

	ELRE_DEBUG(1,
	    (__F, "re_insert() starting: %d at %d max %d, d == \"%s\"\n",
	    num, dat, dlen, ct_encode_string(d, &el->el_scratch)));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", ct_encode_string(s,
	    &el->el_scratch)));

	/* open up the space for num chars */
	if (num > 0) {
		b = d + dlen - 1;
		a = b - num;
		while (a >= &d[dat])
			*b-- = *a--;
		d[dlen] = '\0';	/* just in case */
	}

	ELRE_DEBUG(1, (__F,
		"re_insert() after insert: %d at %d max %d, d == \"%s\"\n",
		num, dat, dlen, ct_encode_string(d, &el->el_scratch)));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", ct_encode_string(s,
		&el->el_scratch)));

	/* copy the characters */
	for (a = d + dat; (a < d + dlen) && (num > 0); num--)
		*a++ = *s++;

#ifdef notyet
        /* ct_encode_string() uses a static buffer, so we can't conveniently
         * encode both d & s here */
	ELRE_DEBUG(1,
	    (__F, "re_insert() after copy: %d at %d max %d, %s == \"%s\"\n",
	    num, dat, dlen, d, s));
	ELRE_DEBUG(1, (__F, "s == \"%s\"\n", s));
#endif
}